

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

int mbedtls_md5_self_test(int verbose)

{
  uchar auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [11];
  undefined1 auVar5 [12];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  uchar uStack_28;
  uchar uStack_27;
  uchar uStack_26;
  uchar uStack_25;
  uchar uStack_24;
  uchar uStack_23;
  uchar uStack_22;
  uchar uStack_21;
  uchar md5sum [16];
  int i;
  int verbose_local;
  
  md5sum[0xc] = '\0';
  md5sum[0xd] = '\0';
  md5sum[0xe] = '\0';
  md5sum[0xf] = '\0';
  while( true ) {
    if (6 < (int)md5sum._12_4_) {
      if (verbose != 0) {
        printf(anon_var_dwarf_66e7a + 8);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  MD5 test #%d: ",(ulong)(md5sum._12_4_ + 1));
    }
    mbedtls_md5(md5_test_buf[(int)md5sum._12_4_],(long)md5_test_buflen[(int)md5sum._12_4_],
                &uStack_28);
    auVar1 = md5_test_sum[(int)md5sum._12_4_];
    cVar8 = -(uStack_28 == auVar1[0]);
    cVar9 = -(uStack_27 == auVar1[1]);
    cVar10 = -(uStack_26 == auVar1[2]);
    cVar11 = -(uStack_25 == auVar1[3]);
    cVar12 = -(uStack_24 == auVar1[4]);
    cVar13 = -(uStack_23 == auVar1[5]);
    cVar14 = -(uStack_22 == auVar1[6]);
    cVar15 = -(uStack_21 == auVar1[7]);
    cVar16 = -(md5sum[0] == auVar1[8]);
    cVar17 = -(md5sum[1] == auVar1[9]);
    cVar18 = -(md5sum[2] == auVar1[10]);
    cVar19 = -(md5sum[3] == auVar1[0xb]);
    cVar20 = -(md5sum[4] == auVar1[0xc]);
    cVar21 = -(md5sum[5] == auVar1[0xd]);
    cVar22 = -(md5sum[6] == auVar1[0xe]);
    bVar23 = -(md5sum[7] == auVar1[0xf]);
    auVar2[1] = cVar9;
    auVar2[0] = cVar8;
    auVar2[2] = cVar10;
    auVar2[3] = cVar11;
    auVar2[4] = cVar12;
    auVar2[5] = cVar13;
    auVar2[6] = cVar14;
    auVar2[7] = cVar15;
    auVar2[8] = cVar16;
    auVar2[9] = cVar17;
    auVar2[10] = cVar18;
    auVar2[0xb] = cVar19;
    auVar2[0xc] = cVar20;
    auVar2[0xd] = cVar21;
    auVar2[0xe] = cVar22;
    auVar2[0xf] = bVar23;
    auVar3[1] = cVar9;
    auVar3[0] = cVar8;
    auVar3[2] = cVar10;
    auVar3[3] = cVar11;
    auVar3[4] = cVar12;
    auVar3[5] = cVar13;
    auVar3[6] = cVar14;
    auVar3[7] = cVar15;
    auVar3[8] = cVar16;
    auVar3[9] = cVar17;
    auVar3[10] = cVar18;
    auVar3[0xb] = cVar19;
    auVar3[0xc] = cVar20;
    auVar3[0xd] = cVar21;
    auVar3[0xe] = cVar22;
    auVar3[0xf] = bVar23;
    auVar7[1] = cVar11;
    auVar7[0] = cVar10;
    auVar7[2] = cVar12;
    auVar7[3] = cVar13;
    auVar7[4] = cVar14;
    auVar7[5] = cVar15;
    auVar7[6] = cVar16;
    auVar7[7] = cVar17;
    auVar7[8] = cVar18;
    auVar7[9] = cVar19;
    auVar7[10] = cVar20;
    auVar7[0xb] = cVar21;
    auVar7[0xc] = cVar22;
    auVar7[0xd] = bVar23;
    auVar6[1] = cVar12;
    auVar6[0] = cVar11;
    auVar6[2] = cVar13;
    auVar6[3] = cVar14;
    auVar6[4] = cVar15;
    auVar6[5] = cVar16;
    auVar6[6] = cVar17;
    auVar6[7] = cVar18;
    auVar6[8] = cVar19;
    auVar6[9] = cVar20;
    auVar6[10] = cVar21;
    auVar6[0xb] = cVar22;
    auVar6[0xc] = bVar23;
    auVar5[1] = cVar13;
    auVar5[0] = cVar12;
    auVar5[2] = cVar14;
    auVar5[3] = cVar15;
    auVar5[4] = cVar16;
    auVar5[5] = cVar17;
    auVar5[6] = cVar18;
    auVar5[7] = cVar19;
    auVar5[8] = cVar20;
    auVar5[9] = cVar21;
    auVar5[10] = cVar22;
    auVar5[0xb] = bVar23;
    auVar4[1] = cVar14;
    auVar4[0] = cVar13;
    auVar4[2] = cVar15;
    auVar4[3] = cVar16;
    auVar4[4] = cVar17;
    auVar4[5] = cVar18;
    auVar4[6] = cVar19;
    auVar4[7] = cVar20;
    auVar4[8] = cVar21;
    auVar4[9] = cVar22;
    auVar4[10] = bVar23;
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar7 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar6 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar5 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar4 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar23,CONCAT18(cVar22,CONCAT17(cVar21,CONCAT16(cVar20,
                                                  CONCAT15(cVar19,CONCAT14(cVar18,CONCAT13(cVar17,
                                                  CONCAT12(cVar16,CONCAT11(cVar15,cVar14))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar23,CONCAT17(cVar22,CONCAT16(cVar21,CONCAT15(cVar20,
                                                  CONCAT14(cVar19,CONCAT13(cVar18,CONCAT12(cVar17,
                                                  CONCAT11(cVar16,cVar15)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar23 >> 7) << 0xf) != 0xffff) break;
    if (verbose != 0) {
      printf("passed\n");
    }
    md5sum._12_4_ = md5sum._12_4_ + 1;
  }
  if (verbose != 0) {
    printf("failed\n");
  }
  return 1;
}

Assistant:

int mbedtls_md5_self_test( int verbose )
{
    int i;
    unsigned char md5sum[16];

    for( i = 0; i < 7; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  MD5 test #%d: ", i + 1 );

        mbedtls_md5( md5_test_buf[i], md5_test_buflen[i], md5sum );

        if( memcmp( md5sum, md5_test_sum[i], 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}